

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O3

void __thiscall cmComputeLinkDepends::OrderLinkEntries(cmComputeLinkDepends *this)

{
  cmComputeComponentGraph *pcVar1;
  int *piVar2;
  undefined4 in_EAX;
  size_type __new_size;
  uint uVar3;
  int *piVar4;
  int n;
  undefined8 uStack_28;
  
  pcVar1 = (this->CCG)._M_t.
           super___uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmComputeComponentGraph_*,_std::default_delete<cmComputeComponentGraph>_>
           .super__Head_base<0UL,_cmComputeComponentGraph_*,_false>._M_head_impl;
  __new_size = ((long)*(pointer *)
                       ((long)&(pcVar1->ComponentGraph).
                               super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_> + 8)
                - *(long *)&(pcVar1->ComponentGraph).
                            super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                            super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_> >>
               3) * -0x5555555555555555;
  uStack_28 = CONCAT44((int)__new_size,in_EAX) & 0xffffffff00ffffff;
  std::vector<char,_std::allocator<char>_>::resize
            (&this->ComponentVisited,__new_size,(value_type *)((long)&uStack_28 + 3));
  std::vector<int,_std::allocator<int>_>::resize
            (&this->ComponentOrder,
             ((long)*(pointer *)
                     ((long)&(pcVar1->ComponentGraph).
                             super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_> + 8) -
              *(long *)&(pcVar1->ComponentGraph).
                        super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                        super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_> >> 3)
             * -0x5555555555555555,(value_type_conflict2 *)((long)&uStack_28 + 4));
  this->ComponentOrderId = uStack_28._4_4_;
  if (0 < uStack_28._4_4_) {
    uVar3 = uStack_28._4_4_ + 1;
    do {
      VisitComponent(this,uVar3 - 2);
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
  }
  if (this->DebugMode != false) {
    DisplayComponents(this);
  }
  piVar2 = (this->OriginalEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar4 = (this->OriginalEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar4 != piVar2; piVar4 = piVar4 + 1) {
    VisitEntry(this,*piVar4);
  }
  while ((this->PendingComponents)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    VisitEntry(this,(this->PendingComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                    [2]._M_parent[1]._M_color);
  }
  return;
}

Assistant:

void cmComputeLinkDepends::OrderLinkEntries()
{
  // The component graph is guaranteed to be acyclic.  Start a DFS
  // from every entry to compute a topological order for the
  // components.
  Graph const& cgraph = this->CCG->GetComponentGraph();
  int n = static_cast<int>(cgraph.size());
  this->ComponentVisited.resize(cgraph.size(), 0);
  this->ComponentOrder.resize(cgraph.size(), n);
  this->ComponentOrderId = n;
  // Run in reverse order so the topological order will preserve the
  // original order where there are no constraints.
  for (int c = n - 1; c >= 0; --c) {
    this->VisitComponent(c);
  }

  // Display the component graph.
  if (this->DebugMode) {
    this->DisplayComponents();
  }

  // Start with the original link line.
  for (int originalEntry : this->OriginalEntries) {
    this->VisitEntry(originalEntry);
  }

  // Now explore anything left pending.  Since the component graph is
  // guaranteed to be acyclic we know this will terminate.
  while (!this->PendingComponents.empty()) {
    // Visit one entry from the first pending component.  The visit
    // logic will update the pending components accordingly.  Since
    // the pending components are kept in topological order this will
    // not repeat one.
    int e = *this->PendingComponents.begin()->second.Entries.begin();
    this->VisitEntry(e);
  }
}